

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::UnpackSnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackSnorm4x8CaseInstance *this)

{
  float *pfVar1;
  ostringstream *poVar2;
  uint uVar3;
  ShaderExecutor *pSVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  TestStatus *pTVar8;
  deUint32 dVar9;
  ostream *poVar10;
  ostream *poVar11;
  TestLog *pTVar12;
  uint *puVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  void *in;
  Random rnd;
  Hex<8UL> local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  UnpackSnorm4x8CaseInstance *local_260;
  uint local_254;
  uint local_250;
  uint local_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  pointer local_218;
  ulong local_210;
  TestStatus *local_208;
  ulong local_200;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [16];
  TestLog local_1c8 [13];
  ios_base local_160 [264];
  undefined1 local_58 [16];
  deRandom local_40;
  
  local_260 = this;
  dVar9 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar9 ^ 0x776002);
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_218 = (pointer)0x0;
  local_228 = (undefined1  [16])0x0;
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_278,(iterator)0x0,(uint *)local_1d8);
  local_1d8._0_4_ = 0x7fff8000;
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_278,
               (iterator)
               local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1d8);
  }
  else {
    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1d8._0_4_ = 0x80007fff;
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_278,
               (iterator)
               local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1d8);
  }
  else {
    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1d8._0_4_ = 0xffffffff;
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_278,
               (iterator)
               local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1d8);
  }
  else {
    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1d8._0_4_ = 0x1fffe;
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_278,
               (iterator)
               local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1d8);
  }
  else {
    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar15 = 0x5f;
  do {
    dVar9 = deRandom_getUint32(&local_40);
    local_1d8._0_4_ = dVar9;
    if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_278,
                 (iterator)
                 local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1d8);
    }
    else {
      *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar9;
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,
             (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1d8._0_8_ = ((local_260->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Executing shader for ",0x15)
  ;
  local_208 = __return_storage_ptr__;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_160);
  local_1d8._0_8_ =
       local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_280.value = local_228._0_8_;
  pSVar4 = (local_260->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar4->_vptr_ShaderExecutor[2])
            (pSVar4,(ulong)((long)local_278.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_278.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1d8,&local_280
             ,0);
  local_210 = (ulong)((long)local_278.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar16 = 0;
  if (0 < (int)local_210) {
    lVar18 = 0;
    lVar17 = 0;
    uVar16 = 0;
    pTVar12 = (TestLog *)
              local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar13 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    auVar24 = extraout_XMM0;
    do {
      uVar19 = *(pointer)((long)&pTVar12->m_log + lVar17 * 4);
      uVar6 = auVar24._0_8_ & 0xffff0000ffff | (ulong)((ushort)(uVar19 >> 0x10) & 0xff00) << 0x10;
      uVar7 = auVar24._8_8_ & 0xffff0000ffff;
      auVar25._0_4_ = (float)((int)uVar6 >> 0x18);
      auVar25._4_4_ = (float)(int)((long)(uVar6 | (ulong)(ushort)(uVar19 >> 8) << 0x30) >> 0x38);
      auVar25._8_4_ = (float)((int)((uint)uVar7 | uVar19 << 0x10) >> 0x18);
      auVar25._12_4_ =
           (float)((int)((uint)(uVar7 >> 0x20) |
                        (uint)(((ulong)(ushort)(uVar19 << 8) << 0x30) >> 0x20)) >> 0x18);
      auVar5._8_4_ = 0x42fe0000;
      auVar5._0_8_ = 0x42fe000042fe0000;
      auVar5._12_4_ = 0x42fe0000;
      auVar26 = divps(auVar25,auVar5);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar24 = minps(auVar23,auVar26);
      uVar19 = -(uint)(auVar26._0_4_ < -1.0);
      uVar20 = -(uint)(auVar26._4_4_ < -1.0);
      uVar21 = -(uint)(auVar26._8_4_ < -1.0);
      uVar22 = -(uint)(auVar26._12_4_ < -1.0);
      auVar27._0_4_ = ~uVar19 & auVar24._0_4_;
      auVar27._4_4_ = ~uVar20 & auVar24._4_4_;
      auVar27._8_4_ = ~uVar21 & auVar24._8_4_;
      auVar27._12_4_ = ~uVar22 & auVar24._12_4_;
      auVar26._8_4_ = uVar21 & 0xbf800000;
      auVar26._0_8_ = CONCAT44(uVar20,uVar19) & 0xbf800000bf800000;
      auVar26._12_4_ = uVar22 & 0xbf800000;
      _local_238 = auVar27 | auVar26;
      pfVar1 = (float *)((long)(float *)local_228._0_8_ + lVar18);
      local_248 = *pfVar1;
      fStack_244 = pfVar1[1];
      fStack_240 = pfVar1[2];
      fStack_23c = pfVar1[3];
      uVar21 = local_238._0_4_;
      uVar22 = local_238._4_4_;
      local_58._8_4_ = local_238._8_4_;
      local_58._12_4_ = local_238._12_4_;
      local_1e8 = -(uint)((int)-fStack_23c < (int)(uVar21 ^ 0x80000000));
      uStack_1e4 = -(uint)((int)-fStack_240 < (int)(uVar22 ^ 0x80000000));
      uStack_1e0 = -(uint)((int)-fStack_244 < (int)(local_58._8_4_ ^ 0x80000000));
      uStack_1dc = -(uint)((int)-local_248 < (int)(local_58._12_4_ ^ 0x80000000));
      uVar19 = *(uint *)((long)(float *)local_228._0_8_ + lVar18 + 8);
      uVar20 = uVar19 - uVar22;
      if ((uStack_1e4 & 1) != 0) {
        uVar20 = uVar22 - uVar19;
      }
      uVar3 = *(uint *)((long)(float *)local_228._0_8_ + lVar18 + 0xc);
      local_254 = uVar3 - uVar21;
      if ((local_1e8 & 1) != 0) {
        local_254 = uVar21 - uVar3;
      }
      local_58._0_8_ = local_238._8_8_;
      local_1f8 = ~uStack_1e0 & (int)fStack_244 - local_58._8_4_ |
                  local_58._8_4_ - (int)fStack_244 & uStack_1e0;
      uStack_1f4 = ~uStack_1dc & (int)local_248 - local_58._12_4_ |
                   local_58._12_4_ - (int)local_248 & uStack_1dc;
      uStack_1f0 = ~uStack_1e0 & (int)fStack_240 - local_58._8_4_ |
                   local_58._8_4_ - (int)fStack_240 & uStack_1e0;
      uStack_1ec = ~uStack_1dc & (int)fStack_23c - local_58._12_4_ |
                   local_58._12_4_ - (int)fStack_23c & uStack_1dc;
      auVar24._0_4_ = -(uint)(-0x7fffffff < (int)(local_1f8 ^ 0x80000000));
      auVar24._4_4_ = -(uint)(-0x7fffffff < (int)(local_1f8 ^ 0x80000000));
      auVar24._8_4_ = -(uint)(-0x7fffffff < (int)(uStack_1f4 ^ 0x80000000));
      auVar24._12_4_ = -(uint)(-0x7fffffff < (int)(uStack_1f4 ^ 0x80000000));
      uVar14 = movmskpd(uVar21 - uVar3,auVar24);
      if ((((uVar14 & 2) != 0) || ((uVar14 & 1) != 0)) || (1 < (uVar20 | local_254))) {
        if ((int)uVar16 < 10) {
          local_1d8._0_8_ = ((local_260->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          poVar2 = (ostringstream *)(local_1d8 + 8);
          local_250 = uVar3;
          local_24c = uVar19;
          local_200 = uVar16;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar2,(int)lVar17);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"  expected unpackSnorm4x8(",0x1a);
          local_280.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_278.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar17 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_280,(ostream *)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"vec4(",5);
          poVar10 = std::ostream::_M_insert<double>((double)fStack_22c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," / ",3);
          local_280.value = (deUint64)(uint)local_238._4_4_;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1d8 + 8),", ",2);
          poVar10 = std::ostream::_M_insert<double>((double)fStack_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," / ",3);
          local_280.value = (deUint64)(uint)local_58._0_4_;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1d8 + 8),", ",2);
          poVar10 = std::ostream::_M_insert<double>((double)(float)local_238._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," / ",3);
          local_280.value = (deUint64)uVar22;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1d8 + 8),", ",2);
          poVar10 = (ostream *)(local_1d8 + 8);
          poVar11 = std::ostream::_M_insert<double>((double)(float)local_238._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," / ",3);
          local_280.value = (deUint64)uVar21;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", got vec4(",0xb);
          poVar11 = std::ostream::_M_insert<double>((double)local_248);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," / ",3);
          local_280.value = (deUint64)(uint)local_248;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          poVar11 = std::ostream::_M_insert<double>((double)fStack_244);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," / ",3);
          local_280.value = (deUint64)(uint)fStack_244;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          poVar11 = std::ostream::_M_insert<double>((double)fStack_240);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," / ",3);
          local_280.value = (deUint64)local_24c;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          poVar11 = std::ostream::_M_insert<double>((double)fStack_23c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," / ",3);
          local_280.value = (deUint64)local_250;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"), max diff = ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar10);
          auVar24._0_8_ = std::ios_base::~ios_base(local_160);
          auVar24._8_8_ = extraout_XMM0_Qb;
          uVar16 = local_200;
        }
        else if ((int)uVar16 == 10) {
          local_1d8._0_8_ = ((local_260->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d8 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1d8 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d8 + 8));
          auVar24._0_8_ = std::ios_base::~ios_base(local_160);
          auVar24._8_8_ = extraout_XMM0_Qb_00;
        }
        uVar16 = (ulong)((int)uVar16 + 1);
        pTVar12 = (TestLog *)
                  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar13 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0x10;
    } while (lVar17 < (int)((ulong)((long)puVar13 - (long)pTVar12) >> 2));
  }
  local_1d8._0_8_ = ((local_260->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  iVar15 = (int)local_210;
  std::ostream::operator<<(poVar2,iVar15 - (int)uVar16);
  pTVar8 = local_208;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
  std::ostream::operator<<(poVar2,iVar15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_160);
  local_1d8._0_8_ = local_1c8;
  if ((int)uVar16 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Pass","");
    pTVar8->m_code = QP_TEST_RESULT_PASS;
    (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar8->m_description,local_1d8._0_8_,
               (long)(qpTestLog **)local_1d8._0_8_ + local_1d8._8_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"Result comparison failed","");
    pTVar8->m_code = QP_TEST_RESULT_FAIL;
    (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar8->m_description,local_1d8._0_8_,
               (long)(qpTestLog **)local_1d8._0_8_ + local_1d8._8_8_);
  }
  if ((TestLog *)local_1d8._0_8_ != local_1c8) {
    operator_delete((void *)local_1d8._0_8_,(ulong)((long)&(local_1c8[0].m_log)->flags + 1));
  }
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,(long)local_218 - local_228._0_8_);
  }
  if ((TestLog *)
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar8;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deInt8	in0		= (deInt8)(deUint8)(inputs[valNdx] & 0xff);
				const deInt8	in1		= (deInt8)(deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deInt8	in2		= (deInt8)(deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deInt8	in3		= (deInt8)(deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 127.f, -1.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 127.f, -1.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 127.f, -1.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 127.f, -1.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackSnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}